

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

char ** hts_readlines(char *fn,int *_n)

{
  int iVar1;
  BGZF *f;
  kstream_t *ks;
  char *pcVar2;
  void *__ptr;
  char *__dest;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  char **ppcVar6;
  char *pcVar7;
  void *local_70;
  char **local_68;
  int dret;
  kstring_t local_48;
  
  f = bgzf_open(fn,"r");
  if (f == (BGZF *)0x0) {
    ppcVar6 = (char **)0x0;
    if (*fn == ':') {
      pcVar2 = fn + 1;
      pcVar7 = fn + 2;
      __ptr = (void *)0x0;
      iVar1 = 0;
      pcVar4 = pcVar2;
      do {
        if ((pcVar7[-1] == ',') || (pcVar7[-1] == '\0')) {
          iVar5 = (int)ppcVar6;
          if (iVar1 == iVar5) {
            iVar1 = iVar5 * 2;
            if (iVar5 == 0) {
              iVar1 = 0x10;
            }
            __ptr = realloc(__ptr,(long)iVar1 << 3);
          }
          __dest = (char *)calloc(((long)pcVar4 - (long)pcVar2) + 1,1);
          *(char **)((long)__ptr + (long)iVar5 * 8) = __dest;
          ppcVar6 = (char **)(ulong)(iVar5 + 1);
          strncpy(__dest,pcVar2,(long)pcVar4 - (long)pcVar2);
          pcVar2 = pcVar7;
          if (pcVar7[-1] == '\0') goto LAB_0010c46a;
        }
        pcVar7 = pcVar7 + 1;
        pcVar4 = pcVar4 + 1;
      } while( true );
    }
  }
  else {
    local_48.l = 0;
    local_48.m = 0;
    local_48.s = (char *)0x0;
    ks = ks_init(f);
    ppcVar6 = (char **)0x0;
    local_70 = (void *)0x0;
    local_68 = (char **)0x0;
    while (iVar1 = ks_getuntil(ks,2,&local_48,&dret), -1 < iVar1) {
      if (local_48.l != 0) {
        if (ppcVar6 == local_68) {
          uVar3 = (int)local_68 * 2;
          if ((int)local_68 == 0) {
            uVar3 = 0x10;
          }
          local_70 = realloc(local_70,(long)(int)uVar3 << 3);
          local_68 = (char **)(ulong)uVar3;
        }
        pcVar2 = strdup(local_48.s);
        *(char **)((long)local_70 + (long)ppcVar6 * 8) = pcVar2;
        ppcVar6 = (char **)((long)ppcVar6 + 1);
      }
    }
    ks_destroy(ks);
    bgzf_close(f);
    __ptr = realloc(local_70,((ulong)ppcVar6 & 0xffffffff) << 3);
    free(local_48.s);
LAB_0010c46a:
    iVar1 = (int)ppcVar6;
    ppcVar6 = (char **)realloc(__ptr,(long)iVar1 * 8);
    *_n = iVar1;
  }
  return ppcVar6;
}

Assistant:

char **hts_readlines(const char *fn, int *_n)
{
    int m = 0, n = 0, dret;
    char **s = 0;
#if KS_BGZF
    BGZF *fp = bgzf_open(fn, "r");
#else
    gzFile fp = gzopen(fn, "r");
#endif
    if ( fp ) { // read from file
        kstream_t *ks;
        kstring_t str;
        str.s = 0; str.l = str.m = 0;
        ks = ks_init(fp);
        while (ks_getuntil(ks, KS_SEP_LINE, &str, &dret) >= 0) {
            if (str.l == 0) continue;
            if (m == n) {
                m = m? m<<1 : 16;
                s = (char**)realloc(s, m * sizeof(char*));
            }
            s[n++] = strdup(str.s);
        }
        ks_destroy(ks);
        #if KS_BGZF
            bgzf_close(fp);
        #else
            gzclose(fp);
        #endif
        s = (char**)realloc(s, n * sizeof(char*));
        free(str.s);
    } else if (*fn == ':') { // read from string
        const char *q, *p;
        for (q = p = fn + 1;; ++p)
            if (*p == ',' || *p == 0) {
                if (m == n) {
                    m = m? m<<1 : 16;
                    s = (char**)realloc(s, m * sizeof(char*));
                }
                s[n] = (char*)calloc(p - q + 1, 1);
                strncpy(s[n++], q, p - q);
                q = p + 1;
                if (*p == 0) break;
            }
    } else return 0;
    s = (char**)realloc(s, n * sizeof(char*));
    *_n = n;
    return s;
}